

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O2

void __thiscall PrintVisitor::visit(PrintVisitor *this,BlockNode *node)

{
  ostream *poVar1;
  _List_node_base *p_Var2;
  PrintVisitor visitor;
  string local_40;
  
  poVar1 = this->stream_;
  indent_abi_cxx11_(&local_40,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  std::operator<<(poVar1,"BlockNode:\n");
  std::__cxx11::string::~string((string *)&local_40);
  local_40._M_string_length = (size_type)this->stream_;
  local_40.field_2._M_allocated_capacity._0_4_ = this->indentation_ + 1;
  local_40._M_dataplus._M_p = (pointer)&PTR__Visitor_00148d30;
  p_Var2 = (_List_node_base *)&node->statements_;
  while (p_Var2 = (((_List_base<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>,_std::allocator<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>_>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&node->statements_) {
    (**(code **)(*(long *)p_Var2[1]._M_next + 0x10))(p_Var2[1]._M_next,&local_40);
  }
  return;
}

Assistant:

void PrintVisitor::visit(const BlockNode& node)
{
  stream_ << indent() << "BlockNode:\n";
  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  for(const auto& statement : node.getStatements())
  {
    statement->accept(visitor);
  }
}